

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

void white_space(D_Parser *p,d_loc_t *loc,void **p_user_globals)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  ushort **ppuVar5;
  bool bVar6;
  char *save;
  char *scol;
  char *s;
  uint rec;
  void **p_user_globals_local;
  d_loc_t *loc_local;
  D_Parser *p_local;
  
  s._4_4_ = 0;
  scol = loc->s;
  save = (char *)0x0;
  if (*scol != '#') goto LAB_001522bf;
  pcVar3 = scol;
  pcVar2 = scol;
  if (loc->col != 0) goto LAB_001522bf;
  do {
    do {
      scol = pcVar2;
      pcVar1 = pcVar3;
      pcVar2 = scol;
      scol = pcVar1 + 1;
      pcVar3 = scol;
    } while (_wspace[(byte)*scol] != '\0');
    iVar4 = strncmp("line",scol,4);
    if ((iVar4 == 0) && (_wspace[(byte)pcVar1[5]] != '\0')) {
      scol = pcVar1 + 6;
      while (_wspace[(byte)*scol] != '\0') {
        scol = scol + 1;
      }
    }
    ppuVar5 = __ctype_b_loc();
    if (((*ppuVar5)[(int)(uint)(byte)*scol] & 0x800) == 0) {
LAB_00152456:
      scol = pcVar2;
      if (save == (char *)0x0) {
        loc->col = loc->col + ((int)scol - (int)loc->s);
      }
      else {
        loc->col = (int)scol - (int)save;
      }
      loc->s = scol;
      return;
    }
    iVar4 = atoi(scol);
    loc->line = iVar4 + -1;
    while (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)(uint)(byte)*scol] & 0x800) != 0) {
      scol = scol + 1;
    }
    while (_wspace[(byte)*scol] != '\0') {
      scol = scol + 1;
    }
    if (*scol == '\"') {
      loc->pathname = scol;
    }
    while( true ) {
      bVar6 = false;
      if (*scol != '\0') {
        bVar6 = *scol != '\n';
      }
      if (!bVar6) break;
      scol = scol + 1;
    }
LAB_001522bf:
    do {
      while (_wspace[(byte)*scol] != '\0') {
        scol = scol + 1;
      }
      if (*scol != '\n') {
        pcVar2 = scol;
        if (*scol != '/') goto LAB_00152456;
        if (scol[1] != '/') {
          if (scol[1] == '*') {
            do {
              scol = scol + 2;
              s._4_4_ = s._4_4_ + 1;
              while( true ) {
                while( true ) {
                  pcVar2 = scol;
                  if (*scol == '\0') goto LAB_00152456;
                  if ((*scol != '*') || (scol[1] != '/')) break;
                  scol = scol + 2;
                  s._4_4_ = s._4_4_ + -1;
                  if (s._4_4_ == 0) goto LAB_001522bf;
                }
                if ((*scol == '/') && (scol[1] == '*')) break;
                if (*scol == '\n') {
                  loc->line = loc->line + 1;
                  save = scol + 1;
                }
                scol = scol + 1;
              }
            } while( true );
          }
          goto LAB_00152456;
        }
        while( true ) {
          bVar6 = false;
          if (*scol != '\0') {
            bVar6 = *scol != '\n';
          }
          if (!bVar6) break;
          scol = scol + 1;
        }
        goto LAB_001522bf;
      }
      loc->line = loc->line + 1;
      save = scol + 1;
      scol = scol + 1;
      pcVar3 = scol;
      pcVar2 = scol;
    } while (*scol != '#');
  } while( true );
}

Assistant:

static void white_space(D_Parser *p, d_loc_t *loc, void **p_user_globals) {
  uint rec = 0;
  char *s = loc->s, *scol = 0;
  (void)p;
  (void)p_user_globals;

  if (*s == '#' && loc->col == 0) {
  Ldirective : {
    char *save = s;
    s++;
    while (wspace(*s)) s++;
    if (!strncmp("line", s, 4)) {
      if (wspace(s[4])) {
        s += 5;
        while (wspace(*s)) s++;
      }
    }
    if (isdigit_(*s)) {
      loc->line = atoi(s) - 1;
      while (isdigit_(*s)) s++;
      while (wspace(*s)) s++;
      if (*s == '"') loc->pathname = s;
    } else {
      s = save;
      goto Ldone;
    }
  }
    while (*s && *s != '\n') s++;
  }
Lmore:
  while (wspace(*s)) s++;
  if (*s == '\n') {
    loc->line++;
    scol = s + 1;
    s++;
    if (*s == '#')
      goto Ldirective;
    else
      goto Lmore;
  }
  if (s[0] == '/') {
    if (s[1] == '/') {
      while (*s && *s != '\n') {
        s++;
      }
      goto Lmore;
    }
    if (s[1] == '*') {
      s += 2;
    LnestComment:
      rec++;
    LmoreComment:
      while (*s) {
        if (s[0] == '*' && s[1] == '/') {
          s += 2;
          rec--;
          if (!rec) goto Lmore;
          goto LmoreComment;
        }
        if (s[0] == '/' && s[1] == '*') {
          s += 2;
          goto LnestComment;
        }
        if (*s == '\n') {
          loc->line++;
          scol = s + 1;
        }
        s++;
      }
    }
  }
Ldone:
  if (scol)
    loc->col = s - scol;
  else
    loc->col += s - loc->s;
  loc->s = s;
  return;
}